

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawImage::Tick
          (CommandDrawImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  APlayerPawn *this_00;
  AHexenArmor *pAVar1;
  PClassActor *type;
  AInventory *pAVar2;
  FTexture *pFVar3;
  int iVar4;
  FTextureID texnum;
  AWeapon *item;
  uint uVar5;
  bool truth;
  double dVar6;
  double dVar7;
  
  SBarInfoCommandFlowControl::Tick
            (&this->super_SBarInfoCommandFlowControl,block,statusBar,hudChanged);
  this->texture = (FTexture *)0x0;
  this->alpha = 1.0;
  if (this->applyscale == true) {
    this->spawnScaleX = 1.0;
    this->spawnScaleY = 1.0;
    this->applyscale = false;
  }
  iVar4 = *(int *)&(this->super_SBarInfoCommandFlowControl).field_0x34;
  switch(iVar4) {
  case 0:
    texnum.texnum = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->ScoreIcon).texnum;
    break;
  case 1:
    item = (AWeapon *)statusBar->ammo1;
    goto LAB_004b40a3;
  case 2:
    item = (AWeapon *)statusBar->ammo2;
    goto LAB_004b40a3;
  case 3:
    item = (AWeapon *)statusBar->armor;
    if ((item == (AWeapon *)0x0) || ((item->super_AStateProvider).super_AInventory.Amount == 0))
    goto LAB_004b40b0;
    goto LAB_004b40a8;
  case 4:
    item = ((statusBar->super_DBaseStatusBar).CPlayer)->ReadyWeapon;
LAB_004b40a3:
    if (item != (AWeapon *)0x0) {
LAB_004b40a8:
      GetIcon(this,(AInventory *)item);
    }
    goto LAB_004b40b0;
  case 5:
    this_00 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    type = PClass::FindActor(NAME_Sigil);
    pAVar2 = AActor::FindInventory(&this_00->super_AActor,type,false);
    if (pAVar2 == (AInventory *)0x0) goto LAB_004b40b0;
    goto LAB_004b4039;
  case 6:
  case 7:
  case 8:
  case 9:
    pAVar1 = AActor::FindInventory<AHexenArmor>
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
    if (pAVar1 == (AHexenArmor *)0x0) goto LAB_004b40b0;
    uVar5 = iVar4 - 6;
    if (pAVar1->Slots[uVar5] <= 0.0) {
      return;
    }
    if (pAVar1->SlotsIncrement[uVar5] <= 0.0) {
      return;
    }
    dVar6 = pAVar1->Slots[uVar5] / pAVar1->SlotsIncrement[uVar5];
    dVar7 = 1.0;
    if (dVar6 <= 1.0) {
      dVar7 = dVar6;
    }
    this->alpha = dVar7 * this->alpha;
    iVar4 = this->image;
    goto LAB_004b4050;
  case 10:
    texnum.texnum = (this->sprite).texnum;
    break;
  default:
switchD_004b3f65_caseD_b:
    iVar4 = this->image;
    if (iVar4 < 0) goto LAB_004b40b0;
LAB_004b4050:
    pFVar3 = FImageCollection::operator[](&statusBar->Images,iVar4);
    goto LAB_004b4072;
  case 0xc:
    pAVar2 = GC::ReadBarrier<AInventory>
                       ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel);
    if (pAVar2 == (AInventory *)0x0) goto switchD_004b3f65_caseD_b;
    pAVar2 = GC::ReadBarrier<AInventory>
                       ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel);
LAB_004b4039:
    texnum.texnum = (pAVar2->Icon).texnum;
  }
  pFVar3 = FTextureManager::operator()(&TexMan,texnum,false);
LAB_004b4072:
  this->texture = pFVar3;
LAB_004b40b0:
  if ((this->flags & 0x80) == 0) {
    return;
  }
  if (this->texture == (FTexture *)0x0) {
    truth = true;
  }
  else {
    truth = this->texture->UseType == '\r';
  }
  SBarInfoCommandFlowControl::SetTruth
            (&this->super_SBarInfoCommandFlowControl,truth,block,statusBar);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			texture = NULL;
			alpha = 1.;
			if (applyscale)
			{
				spawnScaleX = spawnScaleY = 1.0f;
				applyscale = false;
			}
			if(type == PLAYERICON)
				texture = TexMan(statusBar->CPlayer->mo->ScoreIcon);
			else if(type == AMMO1)
			{
				AAmmo *ammo = statusBar->ammo1;
				if(ammo != NULL)
					GetIcon(ammo);
			}
			else if(type == AMMO2)
			{
				AAmmo *ammo = statusBar->ammo2;
				if(ammo != NULL)
					GetIcon(ammo);
			}
			else if(type == ARMOR)
			{
				ABasicArmor *armor = statusBar->armor;
				if(armor != NULL && armor->Amount != 0)
					GetIcon(armor);
			}
			else if(type == WEAPONICON)
			{
				AWeapon *weapon = statusBar->CPlayer->ReadyWeapon;
				if(weapon != NULL)
					GetIcon(weapon);
			}
			else if(type == SIGIL)
			{
				AInventory *item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(NAME_Sigil));
				if (item != NULL)
					texture = TexMan(item->Icon);
			}
			else if(type == HEXENARMOR_ARMOR || type == HEXENARMOR_SHIELD || type == HEXENARMOR_HELM || type == HEXENARMOR_AMULET)
			{
				int armorType = type - HEXENARMOR_ARMOR;
			
				AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
				if (harmor != NULL)
				{
					if (harmor->Slots[armorType] > 0 && harmor->SlotsIncrement[armorType] > 0)
					{
						//combine the alpha values
						alpha *= MIN(1., harmor->Slots[armorType] / harmor->SlotsIncrement[armorType]);
						texture = statusBar->Images[image];
					}
					else
						return;
				}
			}
			else if(type == INVENTORYICON)
				texture = TexMan(sprite);
			else if(type == SELECTEDINVENTORYICON && statusBar->CPlayer->mo->InvSel != NULL)
				texture = TexMan(statusBar->CPlayer->mo->InvSel->Icon);
			else if(image >= 0)
				texture = statusBar->Images[image];
			
			if (flags & DI_ALTERNATEONFAIL)
			{
				SetTruth(texture == NULL || texture->UseType == FTexture::TEX_Null, block, statusBar);
			}
		}